

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O3

void ncnn::convdw3x3s1_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_dequant,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  pointer pfVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  undefined1 auVar12 [16];
  uint uVar13;
  long lVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  uint uVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  void *pvVar21;
  void *pvVar22;
  long lVar23;
  long lVar24;
  void *pvVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  void *pvVar29;
  undefined1 in_ZMM3 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  
  auVar16 = _DAT_00316180;
  auVar15 = _DAT_00316160;
  iVar2 = top_blob->c;
  if (0 < (long)iVar2) {
    iVar3 = top_blob->w;
    iVar4 = top_blob->h;
    iVar5 = bottom_blob->w;
    iVar6 = top_blob->dims;
    pvVar7 = top_blob->data;
    lVar26 = top_blob->cstep * top_blob->elemsize;
    pfVar8 = (scales_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar9 = bottom_blob->cstep;
    sVar10 = bottom_blob->elemsize;
    pvVar11 = bottom_blob->data;
    lVar23 = 0;
    auVar12 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
    pvVar25 = pvVar7;
    do {
      iVar18 = 1;
      if (iVar6 != 3) {
        iVar18 = top_blob->d;
      }
      if (_bias == (Mat *)0x0) {
        auVar30 = ZEXT816(0) << 0x40;
      }
      else {
        auVar30 = ZEXT416(*(uint *)((long)&_bias->data + lVar23 * 4));
      }
      fVar1 = pfVar8[lVar23];
      uVar17 = iVar18 * iVar4 * iVar3;
      if (0 < (int)uVar17) {
        auVar32._8_8_ = 0;
        auVar32._0_8_ = (ulong)uVar17 - 1;
        auVar32 = vpshufd_avx(auVar32,0x44);
        auVar30 = vshufps_avx(auVar30,auVar30,0);
        auVar31._16_16_ = auVar30;
        auVar31._0_16_ = auVar30;
        uVar19 = auVar32._0_8_;
        auVar30._0_8_ = uVar19 ^ 0x8000000000000000;
        auVar30._8_4_ = auVar32._8_4_;
        uVar13 = auVar32._12_4_;
        auVar30._12_4_ = uVar13 ^ 0x80000000;
        auVar33._0_8_ = uVar19 ^ 0x8000000000000000;
        auVar33._8_4_ = auVar30._8_4_;
        auVar33._12_4_ = uVar13 ^ 0x80000000;
        auVar34._0_8_ = uVar19 ^ 0x8000000000000000;
        auVar34._8_4_ = auVar30._8_4_;
        auVar34._12_4_ = uVar13 ^ 0x80000000;
        uVar19 = 0;
        do {
          auVar35._8_8_ = 0;
          auVar35._0_8_ = uVar19;
          auVar32 = vpshufd_avx(auVar35,0x44);
          auVar37._16_16_ = auVar32;
          auVar37._0_16_ = auVar32;
          auVar38 = vorps_avx(auVar37,auVar15);
          auVar37 = vorps_avx(auVar37,auVar16);
          auVar40._0_8_ = auVar37._16_8_ ^ 0x8000000000000000;
          auVar40._8_4_ = auVar37._24_4_;
          auVar40._12_4_ = auVar37._28_4_ ^ 0x80000000;
          auVar32 = vpcmpgtq_avx(auVar40,auVar30);
          auVar36._0_8_ = auVar37._0_8_ ^ 0x8000000000000000;
          auVar36._8_4_ = auVar37._8_4_;
          auVar36._12_4_ = auVar37._12_4_ ^ 0x80000000;
          auVar35 = vpcmpgtq_avx(auVar36,auVar33);
          auVar32 = vpackssdw_avx(auVar35,auVar32);
          auVar41._0_8_ = auVar38._16_8_ ^ 0x8000000000000000;
          auVar41._8_4_ = auVar38._24_4_;
          auVar41._12_4_ = auVar38._28_4_ ^ 0x80000000;
          auVar35 = vpcmpgtq_avx(auVar41,auVar30);
          auVar39._0_8_ = auVar38._0_8_ ^ 0x8000000000000000;
          auVar39._8_4_ = auVar38._8_4_;
          auVar39._12_4_ = auVar38._12_4_ ^ 0x80000000;
          auVar36 = vpcmpgtq_avx(auVar39,auVar34);
          auVar35 = vpackssdw_avx(auVar36,auVar35);
          auVar32 = vpackssdw_avx(auVar35 ^ auVar12,auVar32 ^ auVar12);
          auVar35 = vpmovsxwd_avx(auVar32);
          auVar32 = vpunpckhwd_avx(auVar32,auVar32);
          auVar38._16_16_ = auVar32;
          auVar38._0_16_ = auVar35;
          auVar38 = vmaskmovps_avx(auVar38,auVar31);
          *(undefined1 (*) [32])((long)pvVar25 + uVar19 * 4) = auVar38;
          uVar19 = uVar19 + 8;
        } while ((uVar17 + 7 & 0xfffffff8) != uVar19);
      }
      if (0 < iVar4) {
        pvVar29 = (void *)(lVar26 * lVar23 + (long)pvVar7);
        lVar14 = lVar23 * 9;
        pvVar21 = (void *)(sVar9 * sVar10 * lVar23 + (long)pvVar11);
        pvVar22 = (void *)((long)iVar5 * 2 + (long)pvVar21);
        lVar24 = (long)iVar5 + (long)pvVar21;
        iVar18 = 0;
        do {
          if (0 < iVar3) {
            lVar20 = 2;
            lVar27 = 0;
            lVar28 = 0;
            uVar17 = iVar3 + 1;
            do {
              *(float *)((long)pvVar29 + lVar20 * 4 + -8) =
                   fVar1 * (float)((int)*(char *)((long)&_kernel->refcount + lVar14) *
                                   (int)*(char *)((long)pvVar22 + lVar20) +
                                   (int)*(char *)((long)&_kernel->data + lVar14 + 7) *
                                   (int)*(char *)((long)pvVar22 + lVar20 + -1) +
                                  (int)*(char *)((long)&_kernel->data + lVar14 + 6) *
                                  (int)*(char *)((long)pvVar22 + lVar20 + -2) +
                                  (int)*(char *)((long)&_kernel->data + lVar14 + 5) *
                                  (int)*(char *)(lVar24 + lVar20) +
                                  (int)*(char *)((long)&_kernel->data + lVar14 + 4) *
                                  (int)*(char *)(lVar24 + -1 + lVar20) +
                                  (int)*(char *)((long)&_kernel->data + lVar14 + 3) *
                                  (int)*(char *)(lVar24 + -2 + lVar20) +
                                  (int)*(char *)((long)&_kernel->data + lVar14 + 2) *
                                  (int)*(char *)((long)pvVar21 + lVar20) +
                                  (int)*(char *)((long)&_kernel->data + lVar14 + 1) *
                                  (int)*(char *)((long)pvVar21 + lVar20 + -1) +
                                  (int)*(char *)((long)&_kernel->data + lVar14) *
                                  (int)*(char *)((long)pvVar21 + lVar20 + -2)) +
                   *(float *)((long)pvVar29 + lVar20 * 4 + -8);
              uVar17 = uVar17 - 1;
              lVar28 = lVar28 + -1;
              lVar20 = lVar20 + 1;
              lVar27 = lVar27 + -4;
            } while (1 < uVar17);
            pvVar22 = (void *)((long)pvVar22 - lVar28);
            lVar24 = lVar24 - lVar28;
            pvVar21 = (void *)((long)pvVar21 - lVar28);
            pvVar29 = (void *)((long)pvVar29 - lVar27);
          }
          pvVar21 = (void *)((long)pvVar21 + 2);
          lVar24 = lVar24 + 2;
          pvVar22 = (void *)((long)pvVar22 + 2);
          iVar18 = iVar18 + 1;
        } while (iVar18 != iVar4);
      }
      lVar23 = lVar23 + 1;
      pvVar25 = (void *)((long)pvVar25 + lVar26);
    } while (lVar23 != iVar2);
  }
  return;
}

Assistant:

static void convdw3x3s1_int8_dequant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, std::vector<float> scales_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        float* outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_dequant = scales_dequant[p];

        out.fill(bias0);

        const signed char* kernel0 = (const signed char*)kernel + p * 9;

        const signed char* img0 = bottom_blob.channel(p);
        const signed char* r0 = img0;
        const signed char* r1 = img0 + w;
        const signed char* r2 = img0 + w * 2;

        int i = 0;
        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr += (float)sum * scale_dequant;

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}